

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O3

double __thiscall leveldb::Histogram::Percentile(Histogram *this,double p)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar4 = (p / 100.0) * this->num_;
  dVar5 = this->buckets_[0];
  dVar7 = 0.0;
  dVar8 = dVar5 + 0.0;
  uVar2 = 0;
  if (dVar4 <= dVar5) {
    bVar3 = false;
  }
  else {
    do {
      uVar1 = uVar2;
      if (uVar1 == 0x99) {
        return this->max_;
      }
      dVar5 = this->buckets_[uVar1 + 1];
      dVar8 = dVar8 + dVar5;
      uVar2 = uVar1 + 1;
    } while (dVar8 < dVar4);
    bVar3 = 0x98 < uVar1;
  }
  if (uVar2 != 0) {
    dVar7 = (double)(&kBucketLimit)[(int)uVar2 - 1];
  }
  dVar6 = this->max_;
  if (!bVar3) {
    dVar7 = ((double)(&kBucketLimit)[uVar2] - dVar7) *
            ((dVar4 - (dVar8 - dVar5)) / (dVar8 - (dVar8 - dVar5))) + dVar7;
    dVar5 = this->min_;
    if (this->min_ <= dVar7) {
      dVar5 = dVar7;
    }
    if (dVar5 <= dVar6) {
      dVar6 = dVar5;
    }
  }
  return dVar6;
}

Assistant:

double Histogram::Percentile(double p) const {
  double threshold = num_ * (p / 100.0);
  double sum = 0;
  for (int b = 0; b < kNumBuckets; b++) {
    sum += buckets_[b];
    if (sum >= threshold) {
      // Scale linearly within this bucket
      double left_point = (b == 0) ? 0 : kBucketLimit[b - 1];
      double right_point = kBucketLimit[b];
      double left_sum = sum - buckets_[b];
      double right_sum = sum;
      double pos = (threshold - left_sum) / (right_sum - left_sum);
      double r = left_point + (right_point - left_point) * pos;
      if (r < min_) r = min_;
      if (r > max_) r = max_;
      return r;
    }
  }
  return max_;
}